

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O2

void set_block_bits(uint8_t *pBytes,uint32_t val,uint32_t num_bits,uint32_t *pCur_ofs)

{
  uint uVar1;
  uint uVar2;
  
  for (; num_bits != 0; num_bits = num_bits - uVar2) {
    uVar1 = *pCur_ofs & 7;
    uVar2 = 8 - uVar1;
    if (num_bits <= uVar2) {
      uVar2 = num_bits;
    }
    pBytes[*pCur_ofs >> 3] = pBytes[*pCur_ofs >> 3] | (byte)(val << (sbyte)uVar1);
    val = val >> ((byte)uVar2 & 0x1f);
    *pCur_ofs = *pCur_ofs + uVar2;
  }
  return;
}

Assistant:

static void set_block_bits(uint8_t *pBytes, uint32_t val, uint32_t num_bits, uint32_t *pCur_ofs)
{
	assert((num_bits <= 32) && (val < (1ULL << num_bits)));
	while (num_bits)
	{
		const uint32_t n = minimumu(8 - (*pCur_ofs & 7), num_bits);
		pBytes[*pCur_ofs >> 3] |= (uint8_t)(val << (*pCur_ofs & 7));
		val >>= n;
		num_bits -= n;
		*pCur_ofs += n;
	}
	assert(*pCur_ofs <= 128);
}